

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

void __thiscall
chaiscript::Boxed_Value::
Boxed_Value<std::vector<Utility_Test_Numbers,std::allocator<Utility_Test_Numbers>>,void>
          (Boxed_Value *this,vector<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_> *t,
          bool t_return_value)

{
  vector<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_> local_20;
  
  local_20.super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>._M_impl.
  super__Vector_impl_data._M_start =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_20.super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_20.super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (t->super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Object_Data::get<std::vector<Utility_Test_Numbers,std::allocator<Utility_Test_Numbers>>>
            ((Object_Data *)this,&local_20,t_return_value);
  if (local_20.super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<Utility_Test_Numbers,_std::allocator<Utility_Test_Numbers>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static auto get(std::reference_wrapper<T> obj, bool t_return_value) {
        auto p = &obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), true, p, t_return_value);
      }